

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O2

Context __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
::Convert(RangeConstraintConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
          *this,ItemType *item,int i)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (item->super_AlgConRange).lb_;
  dVar2 = (item->super_AlgConRange).ub_;
  if ((dVar2 != INFINITY) && (dVar1 != -INFINITY)) {
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      ConvertRange(this,item,i);
      return (Context)CTX_ROOT;
    }
  }
  ConvertWithRhs(this,item,
                 (RangeRelations)
                 (((uint3)(dVar1 != -INFINITY) << 8 | (uint3)(dVar2 != INFINITY) << 0x10) +
                 (uint3)(dVar1 != dVar2)));
  return (Context)CTX_ROOT;
}

Assistant:

Context Convert(const ItemType& item, int i) {
    auto rr = Relate(item.lb(), item.ub());
    if (rr[0] && rr[1] && rr[2])
      ConvertRange(item, i);
    else
      ConvertWithRhs(item, rr);
    return Context::CTX_ROOT;
  }